

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_boundary.c
# Opt level: O2

mpt_metatype * iterBoundaryClone(mpt_metatype *mt)

{
  mpt_metatype *pmVar1;
  
  pmVar1 = mpt_iterator_boundary
                     (*(uint32_t *)&mt[7]._vptr,(double)mt[4]._vptr,(double)mt[5]._vptr,
                      (double)mt[6]._vptr);
  if (pmVar1 != (mpt_metatype *)0x0) {
    *(undefined4 *)((long)&pmVar1[9]._vptr + 4) = *(undefined4 *)((long)&mt[7]._vptr + 4);
  }
  return pmVar1;
}

Assistant:

static MPT_INTERFACE(metatype) *iterBoundaryClone(const MPT_INTERFACE(metatype) *mt)
{
	MPT_STRUCT(iteratorBoundary) *d = MPT_baseaddr(iteratorBoundary, mt, _mt);
	MPT_INTERFACE(metatype) *ptr;
	
	if ((ptr = mpt_iterator_boundary(d->elem, d->left, d->inter, d->right))) {
		uint32_t pos = d->pos;
		d = (void *) (ptr + 2);
		d->pos = pos;
	}
	return ptr;
}